

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arg.cpp
# Opt level: O0

bool common_download_model(common_params_model *model,string *bearer_token)

{
  bool bVar1;
  byte bVar2;
  ushort uVar3;
  int iVar4;
  ulong uVar5;
  undefined8 uVar6;
  common_log *pcVar7;
  char split_url [2084];
  char split_path [4096];
  int idx;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  urls;
  char split_url_prefix [2084];
  char split_prefix [4096];
  int64_t key_n_split;
  gguf_context *ctx_gguf;
  gguf_init_params gguf_params;
  int n_split;
  undefined7 in_stack_ffffffffffffce68;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *in_stack_ffffffffffffce80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  allocator<char> *__a;
  char *in_stack_ffffffffffffcea8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  char (*in_stack_ffffffffffffceb8) [2084];
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_ffffffffffffcec0;
  string *in_stack_ffffffffffffcf00;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *in_stack_ffffffffffffcf08;
  undefined1 local_30d8 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_28a8 [11];
  string *in_stack_ffffffffffffd8b8;
  string *in_stack_ffffffffffffd8c0;
  string *in_stack_ffffffffffffd8c8;
  int local_18a4;
  allocator<char> local_1888 [2096];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1058 [128];
  long local_50;
  ulong local_48;
  undefined8 local_40;
  long local_38;
  ulong local_30;
  undefined8 local_28;
  uint local_1c;
  bool local_1;
  
  uVar5 = std::__cxx11::string::empty();
  if ((uVar5 & 1) == 0) {
    bVar1 = common_download_file_single
                      (in_stack_ffffffffffffd8c8,in_stack_ffffffffffffd8c0,in_stack_ffffffffffffd8b8
                      );
    if (bVar1) {
      local_1c = 0;
      local_30 = 1;
      local_28 = 0;
      uVar6 = std::__cxx11::string::c_str();
      local_48 = local_30;
      local_40 = local_28;
      local_38 = gguf_init_from_file(uVar6,local_30 & 0xff,local_28);
      if (local_38 == 0) {
        if (-1 < common_log_verbosity_thold) {
          pcVar7 = common_log_main();
          uVar6 = std::__cxx11::string::c_str();
          common_log_add(pcVar7,GGML_LOG_LEVEL_ERROR,"\n%s:  failed to load input GGUF from %s\n",
                         "common_download_model",uVar6);
        }
        local_1 = false;
      }
      else {
        local_50 = gguf_find_key(local_38);
        if (-1 < local_50) {
          uVar3 = gguf_get_val_u16(local_38);
          local_1c = (uint)uVar3;
        }
        gguf_free(local_38);
        if (1 < (int)local_1c) {
          memset(local_1058,0,0x1000);
          memset(local_1888,0,0x824);
          this_00 = local_1058;
          uVar6 = std::__cxx11::string::c_str();
          iVar4 = llama_split_prefix(this_00,0x1000,uVar6,0,local_1c);
          if (iVar4 == 0) {
            if (-1 < common_log_verbosity_thold) {
              pcVar7 = common_log_main();
              uVar6 = std::__cxx11::string::c_str();
              common_log_add(pcVar7,GGML_LOG_LEVEL_ERROR,
                             "\n%s: unexpected model file name: %s n_split=%d\n",
                             "common_download_model",uVar6,(ulong)local_1c);
            }
            return false;
          }
          __a = local_1888;
          uVar6 = std::__cxx11::string::c_str();
          iVar4 = llama_split_prefix(__a,0x824,uVar6,0,local_1c);
          if (iVar4 == 0) {
            if (-1 < common_log_verbosity_thold) {
              pcVar7 = common_log_main();
              uVar6 = std::__cxx11::string::c_str();
              common_log_add(pcVar7,GGML_LOG_LEVEL_ERROR,
                             "\n%s: unexpected model url: %s n_split=%d\n","common_download_model",
                             uVar6,(ulong)local_1c);
            }
            return false;
          }
          std::
          vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    *)0x1a3dcc);
          for (local_18a4 = 1; local_18a4 < (int)local_1c; local_18a4 = local_18a4 + 1) {
            __rhs = local_28a8;
            __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1000;
            memset(__rhs,0,0x1000);
            llama_split_path(__rhs,__lhs,local_1058,local_18a4,local_1c);
            in_stack_ffffffffffffce80 =
                 (vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)0x824;
            memset(local_30d8,0,0x824);
            llama_split_path(local_30d8,in_stack_ffffffffffffce80,local_1888,local_18a4,local_1c);
            this = (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&stack0xffffffffffffcf07;
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      (this_00,in_stack_ffffffffffffcea8,__a);
            bVar2 = std::operator==(__lhs,__rhs);
            std::__cxx11::string::~string((string *)&stack0xffffffffffffcf08);
            std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffcf07);
            if ((bVar2 & 1) == 0) {
              std::
              pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::pair<char_(&)[2084],_char_(&)[4096],_true>
                        (in_stack_ffffffffffffcec0,in_stack_ffffffffffffceb8,
                         (char (*) [4096])this_00);
              std::
              vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::push_back((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)this,(value_type *)CONCAT17(bVar2,in_stack_ffffffffffffce68));
              std::
              pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::~pair(this);
            }
          }
          common_download_file_multiple(in_stack_ffffffffffffcf08,in_stack_ffffffffffffcf00);
          std::
          vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::~vector(in_stack_ffffffffffffce80);
        }
        local_1 = true;
      }
    }
    else {
      local_1 = false;
    }
  }
  else {
    if (-1 < common_log_verbosity_thold) {
      pcVar7 = common_log_main();
      common_log_add(pcVar7,GGML_LOG_LEVEL_ERROR,"%s: invalid model url\n","common_download_model");
    }
    local_1 = false;
  }
  return local_1;
}

Assistant:

static bool common_download_model(
        const common_params_model & model,
        const std::string & bearer_token) {
    // Basic validation of the model.url
    if (model.url.empty()) {
        LOG_ERR("%s: invalid model url\n", __func__);
        return false;
    }

    if (!common_download_file_single(model.url, model.path, bearer_token)) {
        return false;
    }

    // check for additional GGUFs split to download
    int n_split = 0;
    {
        struct gguf_init_params gguf_params = {
            /*.no_alloc = */ true,
            /*.ctx      = */ NULL,
        };
        auto * ctx_gguf = gguf_init_from_file(model.path.c_str(), gguf_params);
        if (!ctx_gguf) {
            LOG_ERR("\n%s:  failed to load input GGUF from %s\n", __func__, model.path.c_str());
            return false;
        }

        auto key_n_split = gguf_find_key(ctx_gguf, LLM_KV_SPLIT_COUNT);
        if (key_n_split >= 0) {
            n_split = gguf_get_val_u16(ctx_gguf, key_n_split);
        }

        gguf_free(ctx_gguf);
    }

    if (n_split > 1) {
        char split_prefix[PATH_MAX] = {0};
        char split_url_prefix[LLAMA_CURL_MAX_URL_LENGTH] = {0};

        // Verify the first split file format
        // and extract split URL and PATH prefixes
        {
            if (!llama_split_prefix(split_prefix, sizeof(split_prefix), model.path.c_str(), 0, n_split)) {
                LOG_ERR("\n%s: unexpected model file name: %s n_split=%d\n", __func__, model.path.c_str(), n_split);
                return false;
            }

            if (!llama_split_prefix(split_url_prefix, sizeof(split_url_prefix), model.url.c_str(), 0, n_split)) {
                LOG_ERR("\n%s: unexpected model url: %s n_split=%d\n", __func__, model.url.c_str(), n_split);
                return false;
            }
        }

        std::vector<std::pair<std::string, std::string>> urls;
        for (int idx = 1; idx < n_split; idx++) {
            char split_path[PATH_MAX] = {0};
            llama_split_path(split_path, sizeof(split_path), split_prefix, idx, n_split);

            char split_url[LLAMA_CURL_MAX_URL_LENGTH] = {0};
            llama_split_path(split_url, sizeof(split_url), split_url_prefix, idx, n_split);

            if (std::string(split_path) == model.path) {
                continue; // skip the already downloaded file
            }

            urls.push_back({split_url, split_path});
        }

        // Download in parallel
        common_download_file_multiple(urls, bearer_token);
    }

    return true;
}